

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O3

void testing::internal::InitGoogleMockImpl<wchar_t>(int *argc,wchar_t **argv)

{
  int iVar1;
  _Alloc_hider str;
  bool bVar2;
  bool bVar3;
  wchar_t **extraout_RDX;
  bool *value_00;
  wchar_t **extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_01;
  wchar_t **extraout_RDX_01;
  wchar_t **extraout_RDX_02;
  wchar_t **extraout_RDX_03;
  wchar_t **extraout_RDX_04;
  wchar_t **streamable;
  wchar_t **extraout_RDX_05;
  long lVar4;
  int iVar5;
  bool value;
  string arg_string;
  long *local_80 [2];
  long local_70 [2];
  wchar_t **local_60;
  int *local_58;
  string local_50;
  
  InitGoogleTest(argc,argv);
  if (1 < *argc) {
    local_60 = argv + 1;
    iVar5 = 1;
    streamable = extraout_RDX;
    local_58 = argc;
    do {
      StreamableToString<wchar_t*>(&local_50,(internal *)(argv + iVar5),streamable);
      str._M_p = local_50._M_dataplus._M_p;
      local_80[0] = (long *)CONCAT71(local_80[0]._1_7_,FLAGS_gmock_catch_leaked_mocks);
      bVar2 = ParseGoogleMockFlag(local_50._M_dataplus._M_p,(char *)local_80,value_00);
      if (bVar2) {
        FLAGS_gmock_catch_leaked_mocks = local_80[0]._0_1_;
        streamable = extraout_RDX_00;
LAB_0012cf43:
        iVar1 = *argc;
        if (iVar1 != iVar5) {
          streamable = local_60 + iVar5;
          lVar4 = 0;
          do {
            streamable[lVar4 + -1] = streamable[lVar4];
            lVar4 = lVar4 + 1;
          } while (iVar1 - iVar5 != (int)lVar4);
        }
        *argc = iVar1 + -1;
        iVar5 = iVar5 + -1;
      }
      else {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,FLAGS_gmock_verbose_abi_cxx11_,
                   DAT_0026d7b8 + FLAGS_gmock_verbose_abi_cxx11_);
        bVar2 = ParseGoogleMockFlag<std::__cxx11::string>(str._M_p,(char *)local_80,value_01);
        streamable = extraout_RDX_01;
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gmock_verbose_abi_cxx11_);
          streamable = extraout_RDX_02;
        }
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
          streamable = extraout_RDX_03;
        }
        if (!bVar2) {
          local_80[0] = (long *)CONCAT44(local_80[0]._4_4_,FLAGS_gmock_default_mock_behavior);
          bVar3 = ParseGoogleMockFlag(str._M_p,(char *)local_80,(int32_t *)streamable);
          streamable = extraout_RDX_04;
          if (bVar3) {
            FLAGS_gmock_default_mock_behavior = local_80[0]._0_4_;
            bVar2 = true;
          }
        }
        argc = local_58;
        if (bVar2) goto LAB_0012cf43;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        streamable = extraout_RDX_05;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != *argc);
  }
  return;
}

Assistant:

void InitGoogleMockImpl(int* argc, CharType** argv) {
  // Makes sure Google Test is initialized.  InitGoogleTest() is
  // idempotent, so it's fine if the user has already called it.
  InitGoogleTest(argc, argv);
  if (*argc <= 0) return;

  for (int i = 1; i != *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    // Do we see a Google Mock flag?
    bool found_gmock_flag = false;

#define GMOCK_INTERNAL_PARSE_FLAG(flag_name)            \
  if (!found_gmock_flag) {                              \
    auto value = GMOCK_FLAG_GET(flag_name);             \
    if (ParseGoogleMockFlag(arg, #flag_name, &value)) { \
      GMOCK_FLAG_SET(flag_name, value);                 \
      found_gmock_flag = true;                          \
    }                                                   \
  }

    GMOCK_INTERNAL_PARSE_FLAG(catch_leaked_mocks)
    GMOCK_INTERNAL_PARSE_FLAG(verbose)
    GMOCK_INTERNAL_PARSE_FLAG(default_mock_behavior)

    if (found_gmock_flag) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }
}